

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::DBTest_L0_CompactionBug_Issue44_a_Test::TestBody
          (DBTest_L0_CompactionBug_Issue44_a_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar3;
  string sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Env *pEVar6;
  char *pcVar7;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertHelper local_98;
  undefined8 *puStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  string local_68;
  AssertionResult local_48;
  void *local_38;
  
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"b","");
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v","");
  puStack_90 = (undefined8 *)
               CONCAT44(local_68._M_string_length._4_4_,(undefined4)local_68._M_string_length);
  local_98.data_ = (AssertHelperData *)local_68._M_dataplus._M_p;
  local_48._0_4_ = (uint)local_88;
  local_48._4_4_ = local_88._4_4_;
  local_48.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = uStack_80;
  local_48.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = uStack_7c;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_38);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,
             &local_48.success_,(Status *)"Put(\"b\", \"v\")");
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if (local_88 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  PVar3 = local_98.data_._0_1_;
  if (local_98.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (puStack_90 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*puStack_90;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x5b3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
    }
  }
  if (puStack_90 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
      operator_delete((undefined8 *)*puStack_90);
    }
    operator_delete(puStack_90);
  }
  if (PVar3 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"b","");
    local_48._0_4_ = local_48._0_4_ & 0xffffff00;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68._M_dataplus._M_p;
    uStack_80 = (undefined4)local_68._M_string_length;
    uStack_7c = local_68._M_string_length._4_4_;
    (*((this->super_DBTest).db_)->_vptr_DB[3])(&local_98);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_88,
               &local_48.success_,(Status *)"Delete(\"b\")");
    if (local_98.data_ != (AssertHelperData *)0x0) {
      operator_delete__(local_98.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    sVar4 = local_88._0_1_;
    if (local_88._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)CONCAT44(uStack_7c,uStack_80) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT44(uStack_7c,uStack_80);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x5b5,pcVar7);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
      }
    }
    puVar2 = (undefined8 *)CONCAT44(uStack_7c,uStack_80);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    if (sVar4 != (string)0x0) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
      local_48._0_4_ = local_48._0_4_ & 0xffffff00;
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_68._M_dataplus._M_p;
      uStack_80 = (undefined4)local_68._M_string_length;
      uStack_7c = local_68._M_string_length._4_4_;
      (*((this->super_DBTest).db_)->_vptr_DB[3])(&local_98);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_88,
                 &local_48.success_,(Status *)"Delete(\"a\")");
      if (local_98.data_ != (AssertHelperData *)0x0) {
        operator_delete__(local_98.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      sVar4 = local_88._0_1_;
      if (local_88._0_1_ == (string)0x0) {
        testing::Message::Message((Message *)&local_68);
        if ((undefined8 *)CONCAT44(uStack_7c,uStack_80) == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)CONCAT44(uStack_7c,uStack_80);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x5b6,pcVar7);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
        }
      }
      puVar2 = (undefined8 *)CONCAT44(uStack_7c,uStack_80);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      if (sVar4 != (string)0x0) {
        DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
        local_48._0_4_ = local_48._0_4_ & 0xffffff00;
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_68._M_dataplus._M_p;
        uStack_80 = (undefined4)local_68._M_string_length;
        uStack_7c = local_68._M_string_length._4_4_;
        (*((this->super_DBTest).db_)->_vptr_DB[3])(&local_98);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_88,
                   &local_48.success_,(Status *)"Delete(\"a\")");
        if (local_98.data_ != (AssertHelperData *)0x0) {
          operator_delete__(local_98.data_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        sVar4 = local_88._0_1_;
        if (local_88._0_1_ == (string)0x0) {
          testing::Message::Message((Message *)&local_68);
          if ((undefined8 *)CONCAT44(uStack_7c,uStack_80) == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT44(uStack_7c,uStack_80);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x5b8,pcVar7);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
          }
        }
        puVar2 = (undefined8 *)CONCAT44(uStack_7c,uStack_80);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        if (sVar4 != (string)0x0) {
          DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
          local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_78;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v","");
          paVar5 = local_88;
          puStack_90 = (undefined8 *)
                       CONCAT44(local_68._M_string_length._4_4_,
                                (undefined4)local_68._M_string_length);
          local_98.data_ = (AssertHelperData *)local_68._M_dataplus._M_p;
          local_48.success_ = (bool)local_88._0_1_;
          local_48._1_3_ = local_88._1_3_;
          local_48._4_4_ = local_88._4_4_;
          local_48.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = uStack_80;
          local_48.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = uStack_7c;
          local_88 = paVar5;
          (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_38);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_98,
                     &local_48.success_,(Status *)"Put(\"a\", \"v\")");
          if (local_38 != (void *)0x0) {
            operator_delete__(local_38);
          }
          if (local_88 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78) {
            operator_delete(local_88);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          PVar3 = local_98.data_._0_1_;
          if (local_98.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0
             ) {
            testing::Message::Message((Message *)&local_68);
            if (puStack_90 == (undefined8 *)0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = (char *)*puStack_90;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x5ba,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_88,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
            }
          }
          if (puStack_90 != (undefined8 *)0x0) {
            if ((undefined8 *)*puStack_90 != puStack_90 + 2) {
              operator_delete((undefined8 *)*puStack_90);
            }
            operator_delete(puStack_90);
          }
          if (PVar3 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
            DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
            DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
            DBTest::Contents_abi_cxx11_(&local_68,&this->super_DBTest);
            testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
                      ((internal *)&local_88,"\"(a->v)\"","Contents()",(char (*) [7])"(a->v)",
                       &local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar1) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            sVar4 = local_88._0_1_;
            if (local_88._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)&local_68);
              if ((undefined8 *)CONCAT44(uStack_7c,uStack_80) == (undefined8 *)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)CONCAT44(uStack_7c,uStack_80);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,0x5bd,pcVar7);
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
              }
            }
            puVar2 = (undefined8 *)CONCAT44(uStack_7c,uStack_80);
            if (puVar2 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar2 != puVar2 + 2) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            if (sVar4 != (string)0x0) {
              pEVar6 = Env::Default();
              (*pEVar6->_vptr_Env[0x16])(pEVar6,1000000);
              DBTest::Contents_abi_cxx11_(&local_68,&this->super_DBTest);
              testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
                        ((internal *)&local_88,"\"(a->v)\"","Contents()",(char (*) [7])"(a->v)",
                         &local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1) {
                operator_delete(local_68._M_dataplus._M_p);
              }
              if (local_88._0_1_ == (string)0x0) {
                testing::Message::Message((Message *)&local_68);
                if ((undefined8 *)CONCAT44(uStack_7c,uStack_80) == (undefined8 *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = *(char **)CONCAT44(uStack_7c,uStack_80);
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                           ,0x5bf,pcVar7);
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper(&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
                }
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)&local_88);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(DBTest, L0_CompactionBug_Issue44_a) {
  Reopen();
  ASSERT_LEVELDB_OK(Put("b", "v"));
  Reopen();
  ASSERT_LEVELDB_OK(Delete("b"));
  ASSERT_LEVELDB_OK(Delete("a"));
  Reopen();
  ASSERT_LEVELDB_OK(Delete("a"));
  Reopen();
  ASSERT_LEVELDB_OK(Put("a", "v"));
  Reopen();
  Reopen();
  ASSERT_EQ("(a->v)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(a->v)", Contents());
}